

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O3

shared_ptr<MyCompiler::Statement> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Statement>(RecursiveDescentParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  istream *piVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  RecursiveDescentParser *in_RSI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  shared_ptr<MyCompiler::Expression> sVar7;
  shared_ptr<MyCompiler::Statement> sVar8;
  shared_ptr<MyCompiler::Ident> sVar9;
  string local_58;
  
  this->stream = (istream *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MyCompiler::Statement,std::allocator<MyCompiler::Statement>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->currentToken,(Statement **)this,
             (allocator<MyCompiler::Statement> *)&local_58);
  switch(in_RSI->sym) {
  case BEGIN:
    nextSym(in_RSI);
    *(undefined4 *)(this->stream + 4) = 6;
    while( true ) {
      piVar2 = this->stream;
      parse<MyCompiler::Statement>((RecursiveDescentParser *)&local_58);
      std::vector<MyCompiler::Statement,_std::allocator<MyCompiler::Statement>_>::push_back
                ((vector<MyCompiler::Statement,_std::allocator<MyCompiler::Statement>_> *)
                 (piVar2 + 0xa0),(value_type *)local_58._M_dataplus._M_p);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      }
      if (in_RSI->sym != SEMICOLON) break;
      nextSym(in_RSI);
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"semicolon or end expected","");
    except(in_RSI,END,&local_58);
    _Var5._M_pi = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) break;
    goto LAB_00105c41;
  case IF:
    nextSym(in_RSI);
    *(undefined4 *)(this->stream + 4) = 1;
    parse<MyCompiler::Condition>((RecursiveDescentParser *)&local_58);
    sVar4 = local_58._M_string_length;
    _Var3._M_p = local_58._M_dataplus._M_p;
    piVar2 = this->stream;
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar2 + 0x70);
    *(pointer *)(piVar2 + 0x68) = _Var3._M_p;
    *(size_type *)(piVar2 + 0x70) = sVar4;
    if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"then expected","");
    except(in_RSI,THEN,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,(ulong)(local_58.field_2._M_allocated_capacity + 1))
      ;
    }
    sVar8 = parse<MyCompiler::Statement>((RecursiveDescentParser *)&local_58);
    _Var5 = sVar8.super___shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    goto LAB_00105acf;
  case WHILE:
    nextSym(in_RSI);
    *(undefined4 *)(this->stream + 4) = 2;
    parse<MyCompiler::Condition>((RecursiveDescentParser *)&local_58);
    sVar4 = local_58._M_string_length;
    _Var3._M_p = local_58._M_dataplus._M_p;
    piVar2 = this->stream;
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar2 + 0x70);
    *(pointer *)(piVar2 + 0x68) = _Var3._M_p;
    *(size_type *)(piVar2 + 0x70) = sVar4;
    if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"do expected","");
    except(in_RSI,DO,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,(ulong)(local_58.field_2._M_allocated_capacity + 1))
      ;
    }
    sVar8 = parse<MyCompiler::Statement>((RecursiveDescentParser *)&local_58);
    _Var5 = sVar8.super___shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
LAB_00105acf:
    piVar2 = this->stream;
    p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar2 + 0x80);
    *(pointer *)(piVar2 + 0x78) = local_58._M_dataplus._M_p;
    *(size_type *)(piVar2 + 0x80) = local_58._M_string_length;
LAB_00105ae8:
    local_58._M_string_length = 0;
    local_58._M_dataplus._M_p = (pointer)0x0;
    if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
       _Var5._M_pi = extraout_RDX_00,
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      _Var5._M_pi = extraout_RDX_01;
    }
    break;
  case WRITE:
    nextSym(in_RSI);
    *(undefined4 *)(this->stream + 4) = 5;
    paVar1 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"left parenthesis expected","");
    except(in_RSI,LPAREN,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,(ulong)(local_58.field_2._M_allocated_capacity + 1))
      ;
    }
    while( true ) {
      piVar2 = this->stream;
      parse<MyCompiler::Ident>((RecursiveDescentParser *)&local_58);
      std::vector<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_>::push_back
                ((vector<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_> *)(piVar2 + 0x88),
                 (value_type *)local_58._M_dataplus._M_p);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      }
      if (in_RSI->sym != COMMA) break;
      nextSym(in_RSI);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"right parenthesis expected","");
    except(in_RSI,RPAREN,&local_58);
    _Var5._M_pi = extraout_RDX_03;
    goto LAB_00105c38;
  case READ:
    nextSym(in_RSI);
    *(undefined4 *)(this->stream + 4) = 4;
    paVar1 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"left parenthesis expected","");
    except(in_RSI,LPAREN,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,(ulong)(local_58.field_2._M_allocated_capacity + 1))
      ;
    }
    while( true ) {
      piVar2 = this->stream;
      parse<MyCompiler::Ident>((RecursiveDescentParser *)&local_58);
      std::vector<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_>::push_back
                ((vector<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_> *)(piVar2 + 0x88),
                 (value_type *)local_58._M_dataplus._M_p);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      }
      if (in_RSI->sym != COMMA) break;
      nextSym(in_RSI);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"right parenthesis expected","");
    except(in_RSI,RPAREN,&local_58);
    _Var5._M_pi = extraout_RDX_04;
LAB_00105c38:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
LAB_00105c41:
      operator_delete(local_58._M_dataplus._M_p,(ulong)(local_58.field_2._M_allocated_capacity + 1))
      ;
      _Var5._M_pi = extraout_RDX_05;
    }
    break;
  case CALL:
    nextSym(in_RSI);
    *(undefined4 *)(this->stream + 4) = 3;
    sVar9 = parse<MyCompiler::Ident>((RecursiveDescentParser *)&local_58);
    _Var5 = sVar9.super___shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    piVar2 = this->stream;
    p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar2 + 0x50);
    *(pointer *)(piVar2 + 0x48) = local_58._M_dataplus._M_p;
    *(size_type *)(piVar2 + 0x50) = local_58._M_string_length;
    goto LAB_00105ae8;
  default:
    if (in_RSI->sym == IDENT) {
      *(undefined4 *)(this->stream + 4) = 0;
      parse<MyCompiler::Ident>((RecursiveDescentParser *)&local_58);
      sVar4 = local_58._M_string_length;
      _Var3._M_p = local_58._M_dataplus._M_p;
      piVar2 = this->stream;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar2 + 0x50);
      *(pointer *)(piVar2 + 0x48) = _Var3._M_p;
      *(size_type *)(piVar2 + 0x50) = sVar4;
      if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      }
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"assignment operator expected","");
      except(in_RSI,BECOMES,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        (ulong)(local_58.field_2._M_allocated_capacity + 1));
      }
      sVar7 = parse<MyCompiler::Expression>((RecursiveDescentParser *)&local_58);
      _Var5 = sVar7.super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      piVar2 = this->stream;
      p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar2 + 0x60);
      *(pointer *)(piVar2 + 0x58) = local_58._M_dataplus._M_p;
      *(size_type *)(piVar2 + 0x60) = local_58._M_string_length;
      goto LAB_00105ae8;
    }
  case END:
  case THEN:
  case DO:
    *(undefined4 *)(this->stream + 4) = 7;
    _Var5._M_pi = extraout_RDX;
  }
  sVar8.super___shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar8.super___shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Statement>)
         sVar8.super___shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Statement> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Statement>();

    if (sym == SymbolType::IDENT)
    {
        pResult->caseNum = 0;
        pResult->pIdent = parse<Ident>();
        except(SymbolType::BECOMES, "assignment operator expected");
        pResult->pExpression = parse<Expression>();
    }
    else if (accept(SymbolType::IF))
    {
        pResult->caseNum = 1;
        pResult->pCondition = parse<Condition>();
        except(SymbolType::THEN, "then expected");
        pResult->pStatement = parse<Statement>();
    }
    else if (accept(SymbolType::WHILE))
    {
        pResult->caseNum = 2;
        pResult->pCondition = parse<Condition>();
        except(SymbolType::DO, "do expected");
        pResult->pStatement = parse<Statement>();
    }
    else if (accept(SymbolType::CALL))
    {
        pResult->caseNum = 3;
        pResult->pIdent = parse<Ident>();
    }
    else if (accept(SymbolType::READ))
    {
        pResult->caseNum = 4;
        except(SymbolType::LPAREN, "left parenthesis expected");
        do
            pResult->vIdent.push_back(*parse<Ident>());
        while (accept(SymbolType::COMMA));
        except(SymbolType::RPAREN, "right parenthesis expected");
    }
    else if (accept(SymbolType::WRITE))
    {
        pResult->caseNum = 5;
        except(SymbolType::LPAREN, "left parenthesis expected");
        do
            pResult->vIdent.push_back(*parse<Ident>());
        while (accept(SymbolType::COMMA));
        except(SymbolType::RPAREN, "right parenthesis expected");
    }
    else if (accept(SymbolType::BEGIN))
    {
        pResult->caseNum = 6;
        do
            pResult->vStatement.push_back(*parse<Statement>());
        while (accept(SymbolType::SEMICOLON));
        except(SymbolType::END, "semicolon or end expected");
    }
    else
        pResult->caseNum = 7;

    return pResult;
}